

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MockCallTest.cpp
# Opt level: O1

void __thiscall
TEST_MockCallTest_expectAMultiCallThatHappensTheExpectedTimes_Test::testBody
          (TEST_MockCallTest_expectAMultiCallThatHappensTheExpectedTimes_Test *this)

{
  int iVar1;
  MockSupport *pMVar2;
  undefined4 extraout_var;
  UtestShell *pUVar3;
  TestTerminator *pTVar4;
  SimpleString SStack_38;
  SimpleString local_28;
  
  SimpleString::SimpleString(&local_28,"");
  pMVar2 = mock(&local_28,(MockFailureReporter *)0x0);
  SimpleString::SimpleString(&SStack_38,"func");
  (*pMVar2->_vptr_MockSupport[5])(pMVar2,2,&SStack_38);
  SimpleString::~SimpleString(&SStack_38);
  SimpleString::~SimpleString(&local_28);
  SimpleString::SimpleString(&local_28,"");
  pMVar2 = mock(&local_28,(MockFailureReporter *)0x0);
  SimpleString::SimpleString(&SStack_38,"func");
  (*pMVar2->_vptr_MockSupport[6])(pMVar2,&SStack_38);
  SimpleString::~SimpleString(&SStack_38);
  SimpleString::~SimpleString(&local_28);
  SimpleString::SimpleString(&local_28,"");
  pMVar2 = mock(&local_28,(MockFailureReporter *)0x0);
  SimpleString::SimpleString(&SStack_38,"func");
  iVar1 = (*pMVar2->_vptr_MockSupport[6])(pMVar2,&SStack_38);
  SimpleString::~SimpleString(&SStack_38);
  SimpleString::~SimpleString(&local_28);
  (**(code **)(*(long *)CONCAT44(extraout_var,iVar1) + 0x188))((long *)CONCAT44(extraout_var,iVar1))
  ;
  pUVar3 = UtestShell::getCurrent();
  SimpleString::SimpleString(&local_28,"");
  pMVar2 = mock(&local_28,(MockFailureReporter *)0x0);
  iVar1 = (*pMVar2->_vptr_MockSupport[0x26])(pMVar2);
  pTVar4 = UtestShell::getCurrentTestTerminator();
  (*pUVar3->_vptr_UtestShell[8])
            (pUVar3,(ulong)(byte)((byte)iVar1 ^ 1),"CHECK","! mock().expectedCallsLeft()",0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTestExt/MockCallTest.cpp"
             ,0x4a,pTVar4);
  SimpleString::~SimpleString(&local_28);
  return;
}

Assistant:

TEST(MockCallTest, expectAMultiCallThatHappensTheExpectedTimes)
{
    mock().expectNCalls(2, "func");
    mock().actualCall("func");
    MockCheckedActualCall& actualCall = (MockCheckedActualCall&) mock().actualCall("func");
    actualCall.checkExpectations();
    CHECK(! mock().expectedCallsLeft());
}